

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  __errfunc *__errfunc;
  int __flags;
  int __flags_00;
  code *__pattern;
  glob_t *in_R8;
  string local_88;
  allocator local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  glob glob;
  int i;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    pcVar3 = get_base_name(*argv);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,' ');
    poVar2 = std::operator<<(poVar2,"pattern1 [pattern2 [...]]");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    for (glob.impl_._M_t.
         super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>._M_t.
         super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>.
         super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl._4_4_ = 1;
        glob.impl_._M_t.
        super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>._M_t.
        super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>.
        super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl._4_4_ < argc;
        glob.impl_._M_t.
        super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>._M_t.
        super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>.
        super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl._4_4_ =
             glob.impl_._M_t.
             super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>._M_t.
             super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>.
             super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl._4_4_ + 1) {
      __errfunc = (__errfunc *)
                  (long)glob.impl_._M_t.
                        super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>
                        .super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl._4_4_;
      pcVar3 = argv[(long)__errfunc];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,pcVar3,&local_51);
      ::glob::glob::glob((glob *)local_30,(char *)local_50,__flags,__errfunc,in_R8);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      __pattern = (code *)0x1;
      ::glob::glob::use_full_paths((glob *)local_30,true);
      while( true ) {
        bVar1 = ::glob::glob::operator_cast_to_bool((glob *)local_30);
        if (!bVar1) break;
        ::glob::glob::current_match_abi_cxx11_(&local_88,(glob *)local_30);
        poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_88);
        __pattern = std::endl<char,std::char_traits<char>>;
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_88);
        ::glob::glob::next((glob *)local_30);
      }
      ::glob::glob::~glob((glob *)local_30,(char *)__pattern,__flags_00,__errfunc,in_R8);
    }
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    if (argc < 2) {
        std::cerr
            << "Usage: " << get_base_name(argv[0]) << ' '
            << "pattern1 [pattern2 [...]]"
            << std::endl;
        return 1;
    }
    for (int i = 1; i < argc; i++) {
        glob::glob glob(argv[i]);
        glob.use_full_paths(true);
        while (glob) {
            std::cout << glob.current_match() << std::endl;
            glob.next();
        }
    }
    return 0;
}